

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTinySVD.cpp
# Opt level: O2

void verifyOrthonormal<double>(Matrix33<double> *A)

{
  uint __line;
  long lVar1;
  long lVar2;
  Matrix33<double> *pMVar3;
  char *__assertion;
  Matrix33<double> prod;
  Matrix33<double> local_60;
  
  pMVar3 = &prod;
  Imath_2_5::Matrix33<double>::transposed(A);
  Imath_2_5::Matrix33<double>::operator*(&prod,A,&local_60);
  lVar1 = 0;
  do {
    if (lVar1 == 3) {
      return;
    }
    for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
      if (lVar1 == lVar2) {
        if (2.220446049250313e-14 <= ABS(*(double *)((long)prod.x + lVar1 * 0x20) + -1.0)) {
          __assertion = "std::abs (prod[i][j] - 1) < valueEps";
          __line = 0x3a;
LAB_0013dd89:
          __assert_fail(__assertion,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testTinySVD.cpp"
                        ,__line,
                        "void verifyOrthonormal(const Imath_2_5::Matrix33<T> &) [T = double]");
        }
      }
      else if (2.220446049250313e-14 <= ABS(*(double *)((long)pMVar3 + lVar2 * 8))) {
        __assertion = "std::abs (prod[i][j]) < valueEps";
        __line = 0x3c;
        goto LAB_0013dd89;
      }
    }
    lVar1 = lVar1 + 1;
    pMVar3 = (Matrix33<double> *)((long)pMVar3 + 0x18);
  } while( true );
}

Assistant:

void
verifyOrthonormal (const IMATH_INTERNAL_NAMESPACE::Matrix33<T>& A)
{
    const T valueEps = T(100) * std::numeric_limits<T>::epsilon();

    const IMATH_INTERNAL_NAMESPACE::Matrix33<T> prod = A * A.transposed();
    for (int i = 0; i < 3; ++i)
    {
        for (int j = 0; j < 3; ++j)
        {
            if (i == j)
                assert (std::abs (prod[i][j] - 1) < valueEps);
            else
                assert (std::abs (prod[i][j]) < valueEps);
        }
    }
}